

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

void __thiscall LexerTest_LexHexInt_Test::TestBody(LexerTest_LexHexInt_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Token *pTVar3;
  char *in_R9;
  string local_14a8;
  AssertHelper local_1488;
  Message local_1480;
  bool local_1471;
  undefined1 local_1470 [8];
  AssertionResult gtest_ar__19;
  undefined1 local_1450 [8];
  Lexer lexer_19;
  AssertHelper local_13d0;
  Message local_13c8;
  bool local_13b9;
  undefined1 local_13b8 [8];
  AssertionResult gtest_ar__18;
  undefined1 local_1398 [8];
  Lexer lexer_18;
  AssertHelper local_1318;
  Message local_1310;
  bool local_1301;
  undefined1 local_1300 [8];
  AssertionResult gtest_ar__17;
  undefined1 local_12e0 [8];
  Lexer lexer_17;
  AssertHelper local_1260;
  Message local_1258;
  bool local_1249;
  undefined1 local_1248 [8];
  AssertionResult gtest_ar__16;
  undefined1 local_1228 [8];
  Lexer lexer_16;
  AssertHelper local_11a8;
  Message local_11a0;
  bool local_1191;
  undefined1 local_1190 [8];
  AssertionResult gtest_ar__15;
  undefined1 local_1170 [8];
  Lexer lexer_15;
  AssertHelper local_10f0;
  Message local_10e8;
  bool local_10d9;
  undefined1 local_10d8 [8];
  AssertionResult gtest_ar__14;
  undefined1 local_10b8 [8];
  Lexer lexer_14;
  Message local_1050;
  undefined1 local_1048 [8];
  AssertionResult gtest_ar_13;
  undefined1 local_1028 [8];
  Token expected_13;
  AssertHelper local_fc8;
  Message local_fc0;
  bool local_fb1;
  undefined1 local_fb0 [8];
  AssertionResult gtest_ar__13;
  undefined1 local_f90 [8];
  Lexer lexer_13;
  Message local_f28;
  undefined1 local_f20 [8];
  AssertionResult gtest_ar_12;
  undefined1 local_f00 [8];
  Token expected_12;
  AssertHelper local_ea0;
  Message local_e98;
  bool local_e89;
  undefined1 local_e88 [8];
  AssertionResult gtest_ar__12;
  undefined1 local_e68 [8];
  Lexer lexer_12;
  Message local_e00;
  undefined1 local_df8 [8];
  AssertionResult gtest_ar_11;
  undefined1 local_dd8 [8];
  Token expected_11;
  AssertHelper local_d78;
  Message local_d70;
  bool local_d61;
  undefined1 local_d60 [8];
  AssertionResult gtest_ar__11;
  undefined1 local_d40 [8];
  Lexer lexer_11;
  Message local_cd8;
  undefined1 local_cd0 [8];
  AssertionResult gtest_ar_10;
  undefined1 local_cb0 [8];
  Token expected_10;
  AssertHelper local_c50;
  Message local_c48;
  bool local_c39;
  undefined1 local_c38 [8];
  AssertionResult gtest_ar__10;
  undefined1 local_c18 [8];
  Lexer lexer_10;
  Message local_bb0;
  undefined1 local_ba8 [8];
  AssertionResult gtest_ar_9;
  undefined1 local_b88 [8];
  Token expected_9;
  AssertHelper local_b28;
  Message local_b20;
  bool local_b11;
  undefined1 local_b10 [8];
  AssertionResult gtest_ar__9;
  undefined1 local_af0 [8];
  Lexer lexer_9;
  Message local_a88;
  undefined1 local_a80 [8];
  AssertionResult gtest_ar_8;
  undefined1 local_a60 [8];
  Token expected_8;
  AssertHelper local_a00;
  Message local_9f8;
  bool local_9e9;
  undefined1 local_9e8 [8];
  AssertionResult gtest_ar__8;
  undefined1 local_9c8 [8];
  Lexer lexer_8;
  Message local_960;
  undefined1 local_958 [8];
  AssertionResult gtest_ar_7;
  undefined1 local_938 [8];
  Token expected_7;
  AssertHelper local_8d8;
  Message local_8d0;
  bool local_8c1;
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar__7;
  undefined1 local_8a0 [8];
  Lexer lexer_7;
  Message local_838;
  undefined1 local_830 [8];
  AssertionResult gtest_ar_6;
  undefined1 local_810 [8];
  Token expected_6;
  AssertHelper local_7b0;
  Message local_7a8;
  bool local_799;
  undefined1 local_798 [8];
  AssertionResult gtest_ar__6;
  undefined1 local_778 [8];
  Lexer lexer_6;
  Message local_710;
  undefined1 local_708 [8];
  AssertionResult gtest_ar_5;
  undefined1 local_6e8 [8];
  Token expected_5;
  AssertHelper local_688;
  Message local_680;
  bool local_671;
  undefined1 local_670 [8];
  AssertionResult gtest_ar__5;
  undefined1 local_650 [8];
  Lexer lexer_5;
  Message local_5e8;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar_4;
  undefined1 local_5c0 [8];
  Token expected_4;
  AssertHelper local_560;
  Message local_558;
  bool local_549;
  undefined1 local_548 [8];
  AssertionResult gtest_ar__4;
  undefined1 local_528 [8];
  Lexer lexer_4;
  Message local_4c0;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_498 [8];
  Token expected_3;
  AssertHelper local_438;
  Message local_430;
  bool local_421;
  undefined1 local_420 [8];
  AssertionResult gtest_ar__3;
  undefined1 local_400 [8];
  Lexer lexer_3;
  Message local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_370 [8];
  Token expected_2;
  AssertHelper local_310;
  Message local_308;
  bool local_2f9;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar__2;
  undefined1 local_2d8 [8];
  Lexer lexer_2;
  Message local_270;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_248 [8];
  Token expected_1;
  AssertHelper local_1e8;
  Message local_1e0;
  bool local_1d1;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_1b0 [8];
  Lexer lexer_1;
  Message local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar;
  undefined1 local_120 [8];
  Token expected;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0 [3];
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  undefined1 local_70 [8];
  Lexer lexer;
  LexerTest_LexHexInt_Test *this_local;
  
  lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
  super__Optional_payload_base<wasm::WATParser::Token>._64_8_ = this;
  join_0x00000010_0x00000000_ = sv("0x0",3);
  wasm::WATParser::Lexer::Lexer((Lexer *)local_70,join_0x00000010_0x00000000_);
  bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_70);
  local_91 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_90,(AssertionResult *)"lexer.empty()","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x10e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message(local_b0);
  }
  expected.data.
  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  ._45_3_ = 0;
  expected.data.
  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  ._44_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  if (expected.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._44_4_ == 0) {
    _local_120 = sv("0x0",3);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    std::
    variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
    ::variant<wasm::WATParser::IntTok,void,void,wasm::WATParser::IntTok,void>
              ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                *)&expected.span._M_str,(IntTok *)&gtest_ar.message_);
    pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_70);
    testing::internal::EqHelper::Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
              ((EqHelper *)local_140,"*lexer","expected",pTVar3,(Token *)local_120);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
    if (!bVar1) {
      testing::Message::Message(&local_148);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &lexer_1.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                  .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x110,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &lexer_1.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                  .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,&local_148);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &lexer_1.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                  .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
      testing::Message::~Message(&local_148);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
    wasm::WATParser::Token::~Token((Token *)local_120);
    expected.data.
    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ._44_4_ = 0;
  }
  wasm::WATParser::Lexer::~Lexer((Lexer *)local_70);
  if (expected.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._44_4_ == 0) {
    join_0x00000010_0x00000000_ = sv("+0x0",4);
    wasm::WATParser::Lexer::Lexer((Lexer *)local_1b0,join_0x00000010_0x00000000_);
    bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_1b0);
    local_1d1 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1d0,&local_1d1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
    if (!bVar1) {
      testing::Message::Message(&local_1e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 ((long)&expected_1.data.
                         super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                 + 0x28),(internal *)local_1d0,(AssertionResult *)"lexer.empty()","true","false",
                 in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x114,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      std::__cxx11::string::~string
                ((string *)
                 ((long)&expected_1.data.
                         super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                 + 0x28));
      testing::Message::~Message(&local_1e0);
    }
    expected.data.
    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ._45_3_ = 0;
    expected.data.
    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ._44_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
    if (expected.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._44_4_ == 0) {
      _local_248 = sv("+0x0",4);
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      std::
      variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
      ::variant<wasm::WATParser::IntTok,void,void,wasm::WATParser::IntTok,void>
                ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                  *)&expected_1.span._M_str,(IntTok *)&gtest_ar_1.message_);
      pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_1b0);
      testing::internal::EqHelper::Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                ((EqHelper *)local_268,"*lexer","expected",pTVar3,(Token *)local_248);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
      if (!bVar1) {
        testing::Message::Message(&local_270);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   &lexer_2.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                    _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,kNonFatalFailure
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x116,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)
                   &lexer_2.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                    _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,&local_270);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   &lexer_2.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                    _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
        testing::Message::~Message(&local_270);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
      wasm::WATParser::Token::~Token((Token *)local_248);
      expected.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._44_4_ = 0;
    }
    wasm::WATParser::Lexer::~Lexer((Lexer *)local_1b0);
    if (expected.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._44_4_ == 0) {
      join_0x00000010_0x00000000_ = sv("-0x0",4);
      wasm::WATParser::Lexer::Lexer((Lexer *)local_2d8,join_0x00000010_0x00000000_);
      bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_2d8);
      local_2f9 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_2f8,&local_2f9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
      if (!bVar1) {
        testing::Message::Message(&local_308);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)
                   ((long)&expected_2.data.
                           super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                   + 0x28),(internal *)local_2f8,(AssertionResult *)"lexer.empty()","true","false",
                   in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_310,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x11a,pcVar2);
        testing::internal::AssertHelper::operator=(&local_310,&local_308);
        testing::internal::AssertHelper::~AssertHelper(&local_310);
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&expected_2.data.
                           super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                   + 0x28));
        testing::Message::~Message(&local_308);
      }
      expected.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._45_3_ = 0;
      expected.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._44_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
      if (expected.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._44_4_ == 0) {
        _local_370 = sv("-0x0",4);
        gtest_ar_2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        std::
        variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
        ::variant<wasm::WATParser::IntTok,void,void,wasm::WATParser::IntTok,void>
                  ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                    *)&expected_2.span._M_str,(IntTok *)&gtest_ar_2.message_);
        pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_2d8);
        testing::internal::EqHelper::
        Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                  ((EqHelper *)local_390,"*lexer","expected",pTVar3,(Token *)local_370);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
        if (!bVar1) {
          testing::Message::Message(&local_398);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)
                     &lexer_3.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                     kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                     ,0x11c,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)
                     &lexer_3.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,&local_398);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)
                     &lexer_3.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
          testing::Message::~Message(&local_398);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
        wasm::WATParser::Token::~Token((Token *)local_370);
        expected.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._44_4_ = 0;
      }
      wasm::WATParser::Lexer::~Lexer((Lexer *)local_2d8);
      if (expected.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._44_4_ == 0) {
        join_0x00000010_0x00000000_ = sv("0x1",3);
        wasm::WATParser::Lexer::Lexer((Lexer *)local_400,join_0x00000010_0x00000000_);
        bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_400);
        local_421 = (bool)(~bVar1 & 1);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_420,&local_421,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
        if (!bVar1) {
          testing::Message::Message(&local_430);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)
                     ((long)&expected_3.data.
                             super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             .
                             super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             .
                             super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             .
                             super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                     + 0x28),(internal *)local_420,(AssertionResult *)"lexer.empty()","true","false"
                     ,in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_438,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                     ,0x120,pcVar2);
          testing::internal::AssertHelper::operator=(&local_438,&local_430);
          testing::internal::AssertHelper::~AssertHelper(&local_438);
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&expected_3.data.
                             super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             .
                             super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             .
                             super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             .
                             super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                     + 0x28));
          testing::Message::~Message(&local_430);
        }
        expected.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._45_3_ = 0;
        expected.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._44_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
        if (expected.data.
            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ._44_4_ == 0) {
          _local_498 = sv("0x1",3);
          gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x1;
          std::
          variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
          ::variant<wasm::WATParser::IntTok,void,void,wasm::WATParser::IntTok,void>
                    ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                      *)&expected_3.span._M_str,(IntTok *)&gtest_ar_3.message_);
          pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_400);
          testing::internal::EqHelper::
          Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                    ((EqHelper *)local_4b8,"*lexer","expected",pTVar3,(Token *)local_498);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
          if (!bVar1) {
            testing::Message::Message(&local_4c0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)
                       &lexer_4.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                       kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x122,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)
                       &lexer_4.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,&local_4c0);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)
                       &lexer_4.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
            testing::Message::~Message(&local_4c0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
          wasm::WATParser::Token::~Token((Token *)local_498);
          expected.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._44_4_ = 0;
        }
        wasm::WATParser::Lexer::~Lexer((Lexer *)local_400);
        if (expected.data.
            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ._44_4_ == 0) {
          join_0x00000010_0x00000000_ = sv("+0x1",4);
          wasm::WATParser::Lexer::Lexer((Lexer *)local_528,join_0x00000010_0x00000000_);
          bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_528);
          local_549 = (bool)(~bVar1 & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_548,&local_549,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
          if (!bVar1) {
            testing::Message::Message(&local_558);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)
                       ((long)&expected_4.data.
                               super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               .
                               super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               .
                               super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               .
                               super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       + 0x28),(internal *)local_548,(AssertionResult *)"lexer.empty()","true",
                       "false",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_560,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x126,pcVar2);
            testing::internal::AssertHelper::operator=(&local_560,&local_558);
            testing::internal::AssertHelper::~AssertHelper(&local_560);
            std::__cxx11::string::~string
                      ((string *)
                       ((long)&expected_4.data.
                               super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               .
                               super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               .
                               super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               .
                               super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               .
                               super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       + 0x28));
            testing::Message::~Message(&local_558);
          }
          expected.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._45_3_ = 0;
          expected.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._44_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
          if (expected.data.
              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ._44_4_ == 0) {
            _local_5c0 = sv("+0x1",4);
            gtest_ar_4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x1;
            std::
            variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
            ::variant<wasm::WATParser::IntTok,void,void,wasm::WATParser::IntTok,void>
                      ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                        *)&expected_4.span._M_str,(IntTok *)&gtest_ar_4.message_);
            pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_528);
            testing::internal::EqHelper::
            Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                      ((EqHelper *)local_5e0,"*lexer","expected",pTVar3,(Token *)local_5c0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
            if (!bVar1) {
              testing::Message::Message(&local_5e8);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5e0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)
                         &lexer_5.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                         kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                         ,0x128,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)
                         &lexer_5.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,&local_5e8
                        );
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         &lexer_5.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
              testing::Message::~Message(&local_5e8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
            wasm::WATParser::Token::~Token((Token *)local_5c0);
            expected.data.
            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ._44_4_ = 0;
          }
          wasm::WATParser::Lexer::~Lexer((Lexer *)local_528);
          if (expected.data.
              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ._44_4_ == 0) {
            join_0x00000010_0x00000000_ = sv("-0x1",4);
            wasm::WATParser::Lexer::Lexer((Lexer *)local_650,join_0x00000010_0x00000000_);
            bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_650);
            local_671 = (bool)(~bVar1 & 1);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_670,&local_671,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
            if (!bVar1) {
              testing::Message::Message(&local_680);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)
                         ((long)&expected_5.data.
                                 super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         + 0x28),(internal *)local_670,(AssertionResult *)"lexer.empty()","true",
                         "false",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_688,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                         ,300,pcVar2);
              testing::internal::AssertHelper::operator=(&local_688,&local_680);
              testing::internal::AssertHelper::~AssertHelper(&local_688);
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&expected_5.data.
                                 super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         + 0x28));
              testing::Message::~Message(&local_680);
            }
            expected.data.
            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ._45_3_ = 0;
            expected.data.
            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ._44_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
            if (expected.data.
                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ._44_4_ == 0) {
              _local_6e8 = sv("-0x1",4);
              gtest_ar_5.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0xffffffffffffffff;
              std::
              variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
              ::variant<wasm::WATParser::IntTok,void,void,wasm::WATParser::IntTok,void>
                        ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                          *)&expected_5.span._M_str,(IntTok *)&gtest_ar_5.message_);
              pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_650);
              testing::internal::EqHelper::
              Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                        ((EqHelper *)local_708,"*lexer","expected",pTVar3,(Token *)local_6e8);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_708);
              if (!bVar1) {
                testing::Message::Message(&local_710);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_708);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)
                           &lexer_6.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                           kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                           ,0x12e,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)
                           &lexer_6.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                           &local_710);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)
                           &lexer_6.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
                testing::Message::~Message(&local_710);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_708);
              wasm::WATParser::Token::~Token((Token *)local_6e8);
              expected.data.
              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ._44_4_ = 0;
            }
            wasm::WATParser::Lexer::~Lexer((Lexer *)local_650);
            if (expected.data.
                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ._44_4_ == 0) {
              join_0x00000010_0x00000000_ = sv("0x0010",6);
              wasm::WATParser::Lexer::Lexer((Lexer *)local_778,join_0x00000010_0x00000000_);
              bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_778);
              local_799 = (bool)(~bVar1 & 1);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_798,&local_799,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
              if (!bVar1) {
                testing::Message::Message(&local_7a8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)
                           ((long)&expected_6.data.
                                   super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   .
                                   super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           + 0x28),(internal *)local_798,(AssertionResult *)"lexer.empty()","true",
                           "false",in_R9);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_7b0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                           ,0x132,pcVar2);
                testing::internal::AssertHelper::operator=(&local_7b0,&local_7a8);
                testing::internal::AssertHelper::~AssertHelper(&local_7b0);
                std::__cxx11::string::~string
                          ((string *)
                           ((long)&expected_6.data.
                                   super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   .
                                   super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           + 0x28));
                testing::Message::~Message(&local_7a8);
              }
              expected.data.
              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ._45_3_ = 0;
              expected.data.
              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ._44_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
              if (expected.data.
                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ._44_4_ == 0) {
                _local_810 = sv("0x0010",6);
                gtest_ar_6.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x10;
                std::
                variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                ::variant<wasm::WATParser::IntTok,void,void,wasm::WATParser::IntTok,void>
                          ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                            *)&expected_6.span._M_str,(IntTok *)&gtest_ar_6.message_);
                pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_778);
                testing::internal::EqHelper::
                Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                          ((EqHelper *)local_830,"*lexer","expected",pTVar3,(Token *)local_810);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_830);
                if (!bVar1) {
                  testing::Message::Message(&local_838);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_830);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)
                             &lexer_7.curr.
                              super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                             kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x134,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)
                             &lexer_7.curr.
                              super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                             &local_838);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)
                             &lexer_7.curr.
                              super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
                  testing::Message::~Message(&local_838);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_830);
                wasm::WATParser::Token::~Token((Token *)local_810);
                expected.data.
                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ._44_4_ = 0;
              }
              wasm::WATParser::Lexer::~Lexer((Lexer *)local_778);
              if (expected.data.
                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ._44_4_ == 0) {
                join_0x00000010_0x00000000_ = sv("+0x0010",7);
                wasm::WATParser::Lexer::Lexer((Lexer *)local_8a0,join_0x00000010_0x00000000_);
                bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_8a0);
                local_8c1 = (bool)(~bVar1 & 1);
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_8c0,&local_8c1,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_8c0);
                if (!bVar1) {
                  testing::Message::Message(&local_8d0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)
                             ((long)&expected_7.data.
                                     super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     .
                                     super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     .
                                     super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     .
                                     super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             + 0x28),(internal *)local_8c0,(AssertionResult *)"lexer.empty()","true"
                             ,"false",in_R9);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_8d8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x138,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_8d8,&local_8d0);
                  testing::internal::AssertHelper::~AssertHelper(&local_8d8);
                  std::__cxx11::string::~string
                            ((string *)
                             ((long)&expected_7.data.
                                     super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     .
                                     super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     .
                                     super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     .
                                     super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             + 0x28));
                  testing::Message::~Message(&local_8d0);
                }
                expected.data.
                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ._45_3_ = 0;
                expected.data.
                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ._44_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
                if (expected.data.
                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ._44_4_ == 0) {
                  _local_938 = sv("+0x0010",7);
                  gtest_ar_7.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x10;
                  std::
                  variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                  ::variant<wasm::WATParser::IntTok,void,void,wasm::WATParser::IntTok,void>
                            ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                              *)&expected_7.span._M_str,(IntTok *)&gtest_ar_7.message_);
                  pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_8a0);
                  testing::internal::EqHelper::
                  Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                            ((EqHelper *)local_958,"*lexer","expected",pTVar3,(Token *)local_938);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_958);
                  if (!bVar1) {
                    testing::Message::Message(&local_960);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_958)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)
                               &lexer_8.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                               kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                               ,0x13a,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)
                               &lexer_8.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                               &local_960);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)
                               &lexer_8.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
                    testing::Message::~Message(&local_960);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_958);
                  wasm::WATParser::Token::~Token((Token *)local_938);
                  expected.data.
                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ._44_4_ = 0;
                }
                wasm::WATParser::Lexer::~Lexer((Lexer *)local_8a0);
                if (expected.data.
                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ._44_4_ == 0) {
                  join_0x00000010_0x00000000_ = sv("-0x0010",7);
                  wasm::WATParser::Lexer::Lexer((Lexer *)local_9c8,join_0x00000010_0x00000000_);
                  bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_9c8);
                  local_9e9 = (bool)(~bVar1 & 1);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_9e8,&local_9e9,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_9e8);
                  if (!bVar1) {
                    testing::Message::Message(&local_9f8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)
                               ((long)&expected_8.data.
                                       super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       .
                                       super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       .
                                       super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       .
                                       super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               + 0x28),(internal *)local_9e8,(AssertionResult *)"lexer.empty()",
                               "true","false",in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_a00,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                               ,0x13e,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_a00,&local_9f8);
                    testing::internal::AssertHelper::~AssertHelper(&local_a00);
                    std::__cxx11::string::~string
                              ((string *)
                               ((long)&expected_8.data.
                                       super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       .
                                       super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       .
                                       super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       .
                                       super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               + 0x28));
                    testing::Message::~Message(&local_9f8);
                  }
                  expected.data.
                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ._45_3_ = 0;
                  expected.data.
                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ._44_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e8);
                  if (expected.data.
                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ._44_4_ == 0) {
                    _local_a60 = sv("-0x0010",7);
                    gtest_ar_8.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )0xfffffffffffffff0;
                    std::
                    variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                    ::variant<wasm::WATParser::IntTok,void,void,wasm::WATParser::IntTok,void>
                              ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                                *)&expected_8.span._M_str,(IntTok *)&gtest_ar_8.message_);
                    pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_9c8);
                    testing::internal::EqHelper::
                    Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                              ((EqHelper *)local_a80,"*lexer","expected",pTVar3,(Token *)local_a60);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_a80);
                    if (!bVar1) {
                      testing::Message::Message(&local_a88);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_a80);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)
                                 &lexer_9.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                                 kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                 ,0x140,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)
                                 &lexer_9.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                                 &local_a88);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)
                                 &lexer_9.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
                      testing::Message::~Message(&local_a88);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a80);
                    wasm::WATParser::Token::~Token((Token *)local_a60);
                    expected.data.
                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ._44_4_ = 0;
                  }
                  wasm::WATParser::Lexer::~Lexer((Lexer *)local_9c8);
                  if (expected.data.
                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ._44_4_ == 0) {
                    join_0x00000010_0x00000000_ = sv("0xabcdef",8);
                    wasm::WATParser::Lexer::Lexer((Lexer *)local_af0,join_0x00000010_0x00000000_);
                    bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_af0);
                    local_b11 = (bool)(~bVar1 & 1);
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_b10,&local_b11,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_b10);
                    if (!bVar1) {
                      testing::Message::Message(&local_b20);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)
                                 ((long)&expected_9.data.
                                         super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         .
                                         super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 + 0x28),(internal *)local_b10,(AssertionResult *)"lexer.empty()",
                                 "true","false",in_R9);
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_b28,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                 ,0x144,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_b28,&local_b20);
                      testing::internal::AssertHelper::~AssertHelper(&local_b28);
                      std::__cxx11::string::~string
                                ((string *)
                                 ((long)&expected_9.data.
                                         super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         .
                                         super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 + 0x28));
                      testing::Message::~Message(&local_b20);
                    }
                    expected.data.
                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ._45_3_ = 0;
                    expected.data.
                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ._44_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b10);
                    if (expected.data.
                        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ._44_4_ == 0) {
                      _local_b88 = sv("0xabcdef",8);
                      gtest_ar_9.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0xabcdef;
                      std::
                      variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                      ::variant<wasm::WATParser::IntTok,void,void,wasm::WATParser::IntTok,void>
                                ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                                  *)&expected_9.span._M_str,(IntTok *)&gtest_ar_9.message_);
                      pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_af0);
                      testing::internal::EqHelper::
                      Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                                ((EqHelper *)local_ba8,"*lexer","expected",pTVar3,(Token *)local_b88
                                );
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_ba8);
                      if (!bVar1) {
                        testing::Message::Message(&local_bb0);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_ba8);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)
                                   &lexer_10.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged
                                   ,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                   ,0x146,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)
                                   &lexer_10.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged
                                   ,&local_bb0);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)
                                   &lexer_10.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged
                                  );
                        testing::Message::~Message(&local_bb0);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba8);
                      wasm::WATParser::Token::~Token((Token *)local_b88);
                      expected.data.
                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ._44_4_ = 0;
                    }
                    wasm::WATParser::Lexer::~Lexer((Lexer *)local_af0);
                    if (expected.data.
                        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ._44_4_ == 0) {
                      join_0x00000010_0x00000000_ = sv("+0xABCDEF",9);
                      wasm::WATParser::Lexer::Lexer((Lexer *)local_c18,join_0x00000010_0x00000000_);
                      bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_c18);
                      local_c39 = (bool)(~bVar1 & 1);
                      testing::AssertionResult::AssertionResult<bool>
                                ((AssertionResult *)local_c38,&local_c39,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_c38);
                      if (!bVar1) {
                        testing::Message::Message(&local_c48);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)
                                   ((long)&expected_10.data.
                                           super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           .
                                           super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   + 0x28),(internal *)local_c38,(AssertionResult *)"lexer.empty()",
                                   "true","false",in_R9);
                        pcVar2 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_c50,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                   ,0x14a,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_c50,&local_c48);
                        testing::internal::AssertHelper::~AssertHelper(&local_c50);
                        std::__cxx11::string::~string
                                  ((string *)
                                   ((long)&expected_10.data.
                                           super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           .
                                           super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   + 0x28));
                        testing::Message::~Message(&local_c48);
                      }
                      expected.data.
                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ._45_3_ = 0;
                      expected.data.
                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ._44_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c38);
                      if (expected.data.
                          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ._44_4_ == 0) {
                        _local_cb0 = sv("+0xABCDEF",9);
                        gtest_ar_10.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl =
                             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )0xabcdef;
                        std::
                        variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                        ::variant<wasm::WATParser::IntTok,void,void,wasm::WATParser::IntTok,void>
                                  ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                                    *)&expected_10.span._M_str,(IntTok *)&gtest_ar_10.message_);
                        pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_c18);
                        testing::internal::EqHelper::
                        Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                                  ((EqHelper *)local_cd0,"*lexer","expected",pTVar3,
                                   (Token *)local_cb0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_cd0);
                        if (!bVar1) {
                          testing::Message::Message(&local_cd8);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_cd0);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)
                                     &lexer_11.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>.
                                      _M_engaged,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                     ,0x14c,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)
                                     &lexer_11.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>.
                                      _M_engaged,&local_cd8);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)
                                     &lexer_11.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>.
                                      _M_engaged);
                          testing::Message::~Message(&local_cd8);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd0);
                        wasm::WATParser::Token::~Token((Token *)local_cb0);
                        expected.data.
                        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ._44_4_ = 0;
                      }
                      wasm::WATParser::Lexer::~Lexer((Lexer *)local_c18);
                      if (expected.data.
                          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ._44_4_ == 0) {
                        join_0x00000010_0x00000000_ = sv("-0xAbCdEf",9);
                        wasm::WATParser::Lexer::Lexer
                                  ((Lexer *)local_d40,join_0x00000010_0x00000000_);
                        bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_d40);
                        local_d61 = (bool)(~bVar1 & 1);
                        testing::AssertionResult::AssertionResult<bool>
                                  ((AssertionResult *)local_d60,&local_d61,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_d60);
                        if (!bVar1) {
                          testing::Message::Message(&local_d70);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)
                                     ((long)&expected_11.data.
                                             super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             .
                                             super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             .
                                             super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             .
                                             super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             .
                                             super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     + 0x28),(internal *)local_d60,
                                     (AssertionResult *)"lexer.empty()","true","false",in_R9);
                          pcVar2 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_d78,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                     ,0x150,pcVar2);
                          testing::internal::AssertHelper::operator=(&local_d78,&local_d70);
                          testing::internal::AssertHelper::~AssertHelper(&local_d78);
                          std::__cxx11::string::~string
                                    ((string *)
                                     ((long)&expected_11.data.
                                             super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             .
                                             super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             .
                                             super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             .
                                             super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             .
                                             super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     + 0x28));
                          testing::Message::~Message(&local_d70);
                        }
                        expected.data.
                        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ._45_3_ = 0;
                        expected.data.
                        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ._44_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_d60);
                        if (expected.data.
                            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ._44_4_ == 0) {
                          _local_dd8 = sv("-0xAbCdEf",9);
                          gtest_ar_11.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0xffffffffff543211;
                          std::
                          variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                          ::variant<wasm::WATParser::IntTok,void,void,wasm::WATParser::IntTok,void>
                                    ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                                      *)&expected_11.span._M_str,(IntTok *)&gtest_ar_11.message_);
                          pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_d40);
                          testing::internal::EqHelper::
                          Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                                    ((EqHelper *)local_df8,"*lexer","expected",pTVar3,
                                     (Token *)local_dd8);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_df8);
                          if (!bVar1) {
                            testing::Message::Message(&local_e00);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_df8);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)
                                       &lexer_12.curr.
                                        super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                        .super__Optional_payload_base<wasm::WATParser::Token>.
                                        _M_engaged,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x152,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)
                                       &lexer_12.curr.
                                        super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                        .super__Optional_payload_base<wasm::WATParser::Token>.
                                        _M_engaged,&local_e00);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)
                                       &lexer_12.curr.
                                        super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                        .super__Optional_payload_base<wasm::WATParser::Token>.
                                        _M_engaged);
                            testing::Message::~Message(&local_e00);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_df8);
                          wasm::WATParser::Token::~Token((Token *)local_dd8);
                          expected.data.
                          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ._44_4_ = 0;
                        }
                        wasm::WATParser::Lexer::~Lexer((Lexer *)local_d40);
                        if (expected.data.
                            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ._44_4_ == 0) {
                          join_0x00000010_0x00000000_ = sv("0x12_34",7);
                          wasm::WATParser::Lexer::Lexer
                                    ((Lexer *)local_e68,join_0x00000010_0x00000000_);
                          bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e68);
                          local_e89 = (bool)(~bVar1 & 1);
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_e88,&local_e89,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_e88);
                          if (!bVar1) {
                            testing::Message::Message(&local_e98);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)
                                       ((long)&expected_12.data.
                                               super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               .
                                               super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               .
                                               super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               .
                                               super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               .
                                               super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       + 0x28),(internal *)local_e88,
                                       (AssertionResult *)"lexer.empty()","true","false",in_R9);
                            pcVar2 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_ea0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x156,pcVar2);
                            testing::internal::AssertHelper::operator=(&local_ea0,&local_e98);
                            testing::internal::AssertHelper::~AssertHelper(&local_ea0);
                            std::__cxx11::string::~string
                                      ((string *)
                                       ((long)&expected_12.data.
                                               super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               .
                                               super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               .
                                               super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               .
                                               super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               .
                                               super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       + 0x28));
                            testing::Message::~Message(&local_e98);
                          }
                          expected.data.
                          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ._45_3_ = 0;
                          expected.data.
                          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ._44_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_e88);
                          if (expected.data.
                              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              ._44_4_ == 0) {
                            _local_f00 = sv("0x12_34",7);
                            gtest_ar_12.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl =
                                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )0x1234;
                            std::
                            variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                            ::
                            variant<wasm::WATParser::IntTok,void,void,wasm::WATParser::IntTok,void>
                                      ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                                        *)&expected_12.span._M_str,(IntTok *)&gtest_ar_12.message_);
                            pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_e68);
                            testing::internal::EqHelper::
                            Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                                      ((EqHelper *)local_f20,"*lexer","expected",pTVar3,
                                       (Token *)local_f00);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_f20);
                            if (!bVar1) {
                              testing::Message::Message(&local_f28);
                              pcVar2 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_f20);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)
                                         &lexer_13.curr.
                                          super__Optional_base<wasm::WATParser::Token,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                          .super__Optional_payload_base<wasm::WATParser::Token>.
                                          _M_engaged,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                         ,0x158,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)
                                         &lexer_13.curr.
                                          super__Optional_base<wasm::WATParser::Token,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                          .super__Optional_payload_base<wasm::WATParser::Token>.
                                          _M_engaged,&local_f28);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)
                                         &lexer_13.curr.
                                          super__Optional_base<wasm::WATParser::Token,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                          .super__Optional_payload_base<wasm::WATParser::Token>.
                                          _M_engaged);
                              testing::Message::~Message(&local_f28);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_f20)
                            ;
                            wasm::WATParser::Token::~Token((Token *)local_f00);
                            expected.data.
                            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ._44_4_ = 0;
                          }
                          wasm::WATParser::Lexer::~Lexer((Lexer *)local_e68);
                          if (expected.data.
                              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              ._44_4_ == 0) {
                            join_0x00000010_0x00000000_ = sv("0x1_2_3_4",9);
                            wasm::WATParser::Lexer::Lexer
                                      ((Lexer *)local_f90,join_0x00000010_0x00000000_);
                            bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_f90);
                            local_fb1 = (bool)(~bVar1 & 1);
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_fb0,&local_fb1,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_fb0);
                            if (!bVar1) {
                              testing::Message::Message(&local_fc0);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)
                                         ((long)&expected_13.data.
                                                 super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 .
                                                 super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 .
                                                 super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 .
                                                 super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 .
                                                 super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         + 0x28),(internal *)local_fb0,
                                         (AssertionResult *)"lexer.empty()","true","false",in_R9);
                              pcVar2 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_fc8,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                         ,0x15c,pcVar2);
                              testing::internal::AssertHelper::operator=(&local_fc8,&local_fc0);
                              testing::internal::AssertHelper::~AssertHelper(&local_fc8);
                              std::__cxx11::string::~string
                                        ((string *)
                                         ((long)&expected_13.data.
                                                 super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 .
                                                 super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 .
                                                 super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 .
                                                 super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 .
                                                 super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         + 0x28));
                              testing::Message::~Message(&local_fc0);
                            }
                            expected.data.
                            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ._45_3_ = 0;
                            expected.data.
                            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ._44_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_fb0)
                            ;
                            if (expected.data.
                                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ._44_4_ == 0) {
                              _local_1028 = sv("0x1_2_3_4",9);
                              gtest_ar_13.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl =
                                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )0x1234;
                              std::
                              variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                              ::
                              variant<wasm::WATParser::IntTok,void,void,wasm::WATParser::IntTok,void>
                                        ((variant<wasm::WATParser::LParenTok,wasm::WATParser::RParenTok,wasm::WATParser::IdTok,wasm::WATParser::IntTok,wasm::WATParser::FloatTok,wasm::WATParser::StringTok,wasm::WATParser::KeywordTok>
                                          *)&expected_13.span._M_str,(IntTok *)&gtest_ar_13.message_
                                        );
                              pTVar3 = wasm::WATParser::Lexer::operator*((Lexer *)local_f90);
                              testing::internal::EqHelper::
                              Compare<wasm::WATParser::Token,_wasm::WATParser::Token,_nullptr>
                                        ((EqHelper *)local_1048,"*lexer","expected",pTVar3,
                                         (Token *)local_1028);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1048);
                              if (!bVar1) {
                                testing::Message::Message(&local_1050);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_1048);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)
                                           &lexer_14.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x15e,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)
                                           &lexer_14.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged,&local_1050);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)
                                           &lexer_14.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged);
                                testing::Message::~Message(&local_1050);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1048);
                              wasm::WATParser::Token::~Token((Token *)local_1028);
                              expected.data.
                              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              ._44_4_ = 0;
                            }
                            wasm::WATParser::Lexer::~Lexer((Lexer *)local_f90);
                            if (expected.data.
                                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ._44_4_ == 0) {
                              join_0x00000010_0x00000000_ = sv("_0x1234",7);
                              wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_10b8,join_0x00000010_0x00000000_);
                              local_10d9 = wasm::WATParser::Lexer::empty((Lexer *)local_10b8);
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_10d8,&local_10d9,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_10d8);
                              if (!bVar1) {
                                testing::Message::Message(&local_10e8);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)
                                           &lexer_15.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged,(internal *)local_10d8,
                                           (AssertionResult *)"lexer.empty()","false","true",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_10f0,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x162,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_10f0,&local_10e8);
                                testing::internal::AssertHelper::~AssertHelper(&local_10f0);
                                std::__cxx11::string::~string
                                          ((string *)
                                           &lexer_15.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged);
                                testing::Message::~Message(&local_10e8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_10d8);
                              wasm::WATParser::Lexer::~Lexer((Lexer *)local_10b8);
                              join_0x00000010_0x00000000_ = sv("0x_1234",7);
                              wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_1170,join_0x00000010_0x00000000_);
                              local_1191 = wasm::WATParser::Lexer::empty((Lexer *)local_1170);
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_1190,&local_1191,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1190);
                              if (!bVar1) {
                                testing::Message::Message(&local_11a0);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)
                                           &lexer_16.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged,(internal *)local_1190,
                                           (AssertionResult *)"lexer.empty()","false","true",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_11a8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x166,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_11a8,&local_11a0);
                                testing::internal::AssertHelper::~AssertHelper(&local_11a8);
                                std::__cxx11::string::~string
                                          ((string *)
                                           &lexer_16.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged);
                                testing::Message::~Message(&local_11a0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1190);
                              wasm::WATParser::Lexer::~Lexer((Lexer *)local_1170);
                              join_0x00000010_0x00000000_ = sv("0x1234_",7);
                              wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_1228,join_0x00000010_0x00000000_);
                              local_1249 = wasm::WATParser::Lexer::empty((Lexer *)local_1228);
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_1248,&local_1249,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1248);
                              if (!bVar1) {
                                testing::Message::Message(&local_1258);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)
                                           &lexer_17.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged,(internal *)local_1248,
                                           (AssertionResult *)"lexer.empty()","false","true",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_1260,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x16a,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_1260,&local_1258);
                                testing::internal::AssertHelper::~AssertHelper(&local_1260);
                                std::__cxx11::string::~string
                                          ((string *)
                                           &lexer_17.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged);
                                testing::Message::~Message(&local_1258);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1248);
                              wasm::WATParser::Lexer::~Lexer((Lexer *)local_1228);
                              join_0x00000010_0x00000000_ = sv("0x12__34",8);
                              wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_12e0,join_0x00000010_0x00000000_);
                              local_1301 = wasm::WATParser::Lexer::empty((Lexer *)local_12e0);
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_1300,&local_1301,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1300);
                              if (!bVar1) {
                                testing::Message::Message(&local_1310);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)
                                           &lexer_18.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged,(internal *)local_1300,
                                           (AssertionResult *)"lexer.empty()","false","true",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_1318,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x16e,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_1318,&local_1310);
                                testing::internal::AssertHelper::~AssertHelper(&local_1318);
                                std::__cxx11::string::~string
                                          ((string *)
                                           &lexer_18.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged);
                                testing::Message::~Message(&local_1310);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1300);
                              wasm::WATParser::Lexer::~Lexer((Lexer *)local_12e0);
                              join_0x00000010_0x00000000_ = sv("0xg",3);
                              wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_1398,join_0x00000010_0x00000000_);
                              local_13b9 = wasm::WATParser::Lexer::empty((Lexer *)local_1398);
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_13b8,&local_13b9,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_13b8);
                              if (!bVar1) {
                                testing::Message::Message(&local_13c8);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)
                                           &lexer_19.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged,(internal *)local_13b8,
                                           (AssertionResult *)"lexer.empty()","false","true",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_13d0,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x172,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_13d0,&local_13c8);
                                testing::internal::AssertHelper::~AssertHelper(&local_13d0);
                                std::__cxx11::string::~string
                                          ((string *)
                                           &lexer_19.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged);
                                testing::Message::~Message(&local_13c8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_13b8);
                              wasm::WATParser::Lexer::~Lexer((Lexer *)local_1398);
                              join_0x00000010_0x00000000_ = sv("0x120x34",8);
                              wasm::WATParser::Lexer::Lexer
                                        ((Lexer *)local_1450,join_0x00000010_0x00000000_);
                              local_1471 = wasm::WATParser::Lexer::empty((Lexer *)local_1450);
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_1470,&local_1471,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1470);
                              if (!bVar1) {
                                testing::Message::Message(&local_1480);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          (&local_14a8,(internal *)local_1470,
                                           (AssertionResult *)"lexer.empty()","false","true",in_R9);
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_1488,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x176,pcVar2);
                                testing::internal::AssertHelper::operator=(&local_1488,&local_1480);
                                testing::internal::AssertHelper::~AssertHelper(&local_1488);
                                std::__cxx11::string::~string((string *)&local_14a8);
                                testing::Message::~Message(&local_1480);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1470);
                              wasm::WATParser::Lexer::~Lexer((Lexer *)local_1450);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(LexerTest, LexHexInt) {
  {
    Lexer lexer("0x0"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"0x0"sv, IntTok{0, NoSign}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("+0x0"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"+0x0"sv, IntTok{0, Pos}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("-0x0"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"-0x0"sv, IntTok{0, Neg}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("0x1"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"0x1"sv, IntTok{1, NoSign}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("+0x1"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"+0x1"sv, IntTok{1, Pos}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("-0x1"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"-0x1"sv, IntTok{-1ull, Neg}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("0x0010"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"0x0010"sv, IntTok{16, NoSign}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("+0x0010"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"+0x0010"sv, IntTok{16, Pos}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("-0x0010"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"-0x0010"sv, IntTok{-16ull, Neg}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("0xabcdef"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"0xabcdef"sv, IntTok{0xabcdef, NoSign}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("+0xABCDEF"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"+0xABCDEF"sv, IntTok{0xabcdef, Pos}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("-0xAbCdEf"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"-0xAbCdEf"sv, IntTok{-0xabcdefull, Neg}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("0x12_34"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"0x12_34"sv, IntTok{0x1234, NoSign}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("0x1_2_3_4"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"0x1_2_3_4"sv, IntTok{0x1234, NoSign}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("_0x1234"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("0x_1234"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("0x1234_"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("0x12__34"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("0xg"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("0x120x34"sv);
    EXPECT_TRUE(lexer.empty());
  }
}